

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_traverse_tree(archive_write *a,vdd *vdd)

{
  time_t *ptVar1;
  wchar_t wVar2;
  long *in_RSI;
  long in_RDI;
  _func_int_archive_write_ptr_isoent_ptr_idr_ptr *genid;
  int r;
  int depth;
  idr idr;
  isoent *np;
  iso9660_conflict *iso9660;
  vdd *in_stack_ffffffffffffff18;
  code *pcVar3;
  undefined4 in_stack_ffffffffffffff20;
  int iVar4;
  undefined4 in_stack_ffffffffffffff24;
  int iVar5;
  idr *in_stack_ffffffffffffff28;
  isoent *in_stack_ffffffffffffff30;
  archive_write *in_stack_ffffffffffffff38;
  long local_20;
  
  ptVar1 = *(time_t **)(in_RDI + 0xd0);
  idr_init((iso9660_conflict *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
           in_stack_ffffffffffffff18,(idr *)0x184868);
  local_20 = *in_RSI;
  iVar5 = 0;
  if ((int)in_RSI[1] == 1) {
    pcVar3 = isoent_gen_joliet_identifier;
  }
  else {
    pcVar3 = isoent_gen_iso9660_identifier;
  }
  do {
    if (((char)(*(char *)(local_20 + 0xe8) << 7) < '\0') &&
       (wVar2 = archive_entry_mtime_is_set(*(archive_entry **)(*(long *)(local_20 + 0x18) + 0x20)),
       wVar2 == L'\0')) {
      archive_entry_set_mtime(*(archive_entry **)(*(long *)(local_20 + 0x18) + 0x20),*ptVar1,0);
      archive_entry_set_atime(*(archive_entry **)(*(long *)(local_20 + 0x18) + 0x20),*ptVar1,0);
      archive_entry_set_ctime(*(archive_entry **)(*(long *)(local_20 + 0x18) + 0x20),*ptVar1,0);
    }
    if (*(long *)(local_20 + 0x28) == 0) {
LAB_00184a68:
      for (; local_20 != *(long *)(local_20 + 0x20); local_20 = *(long *)(local_20 + 0x20)) {
        if (*(long *)(local_20 + 0x78) != 0) {
          local_20 = *(long *)(local_20 + 0x78);
          break;
        }
        iVar5 = iVar5 + -1;
      }
    }
    else {
      if ((((int)in_RSI[1] != 1) && ((*(uint *)(ptVar1 + 0x206e) >> 0x17 & 3) == 0)) &&
         ((int)in_RSI[3] <= iVar5 + 1)) {
        if (0 < *(int *)(local_20 + 0x38)) {
          ptVar1[0x5a] = local_20;
        }
        goto LAB_00184a68;
      }
      iVar4 = (*pcVar3)(in_RDI,local_20,&stack0xffffffffffffff28);
      if ((iVar4 < 0) ||
         (iVar4 = isoent_make_sorted_files
                            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                             in_stack_ffffffffffffff28), iVar4 < 0)) goto LAB_00184aea;
      if ((*(long *)(local_20 + 0x50) == 0) || ((int)in_RSI[3] <= iVar5 + 1)) goto LAB_00184a68;
      local_20 = *(long *)(local_20 + 0x50);
      iVar5 = iVar5 + 1;
    }
  } while (local_20 != *(long *)(local_20 + 0x20));
  iVar4 = 0;
LAB_00184aea:
  idr_cleanup((idr *)0x184af4);
  return iVar4;
}

Assistant:

static int
isoent_traverse_tree(struct archive_write *a, struct vdd* vdd)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *np;
	struct idr idr;
	int depth;
	int r;
	int (*genid)(struct archive_write *, struct isoent *, struct idr *);

	idr_init(iso9660, vdd, &idr);
	np = vdd->rootent;
	depth = 0;
	if (vdd->vdd_type == VDD_JOLIET)
		genid = isoent_gen_joliet_identifier;
	else
		genid = isoent_gen_iso9660_identifier;
	do {
		if (np->virtual &&
		    !archive_entry_mtime_is_set(np->file->entry)) {
			/* Set properly times to virtual directory */
			archive_entry_set_mtime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_atime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_ctime(np->file->entry,
			    iso9660->birth_time, 0);
		}
		if (np->children.first != NULL) {
			if (vdd->vdd_type != VDD_JOLIET &&
			    !iso9660->opt.rr && depth + 1 >= vdd->max_depth) {
				if (np->children.cnt > 0)
					iso9660->directories_too_deep = np;
			} else {
				/* Generate Identifier */
				r = genid(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;
				r = isoent_make_sorted_files(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;

				if (np->subdirs.first != NULL &&
				    depth + 1 < vdd->max_depth) {
					/* Enter to sub directories. */
					np = np->subdirs.first;
					depth++;
					continue;
				}
			}
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	r = ARCHIVE_OK;
exit_traverse_tree:
	idr_cleanup(&idr);

	return (r);
}